

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_remove(map *m,int idx,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  int idx_local;
  map *m_local;
  int local_4;
  
  bVar1 = true;
  if (-1 < idx) {
    bVar1 = (int)m->len < idx;
  }
  if (bVar1) {
    local_4 = -1;
  }
  else {
    LOCK();
    bVar1 = ptr == (void *)m->data[idx];
    if (bVar1) {
      m->data[idx] = 0;
    }
    UNLOCK();
    if (bVar1) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int
map_remove(struct map *m, int idx, void *ptr)
{
    if (unlikely(idx < 0 || idx > (int)m->len))
           return (-1);

    if (atomic_ptr_cas(&(m->data[idx]), ptr, NULL)) {
        dbg_printf("idx=%i - removed ptr=%p from map", idx, (void *)ptr);
        return (0);
    } else {
        dbg_printf("idx=%i - removal failed, ptr=%p != cur_ptr=%p", idx, ptr, (void *)m->data[idx]);
        return (-1);
    }
}